

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecFindCost(Sfm_Dec_t *p,int c,int iLit,word *pMask)

{
  uint uVar1;
  word *pwVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  bVar8 = c == 0;
  uVar5 = iLit * 4 & 0xfffffff8;
  if ((int)uVar5 < p->vSets[bVar8].nSize) {
    pwVar2 = p->vSets[bVar8].pArray;
    uVar1 = p->nPatWords[bVar8];
    if ((iLit & 1U) == 0) {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        iVar3 = 0;
        do {
          uVar7 = pwVar2[uVar5 + uVar6] & pMask[uVar6];
          uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
          uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
          uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
          uVar7 = (uVar7 >> 8) + uVar7;
          lVar4 = (uVar7 >> 0x10) + uVar7;
          iVar3 = iVar3 + ((int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xffU);
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
        return iVar3;
      }
    }
    else if (0 < (int)uVar1) {
      uVar6 = 0;
      iVar3 = 0;
      do {
        uVar7 = ~pwVar2[uVar5 + uVar6] & pMask[uVar6];
        uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
        uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
        uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
        uVar7 = (uVar7 >> 8) + uVar7;
        lVar4 = (uVar7 >> 0x10) + uVar7;
        iVar3 = iVar3 + ((int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xffU);
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      return iVar3;
    }
    return 0;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Sfm_DecFindCost( Sfm_Dec_t * p, int c, int iLit, word * pMask )
{
    word * pPats = Sfm_DecDivPats( p, Abc_Lit2Var(iLit), !c );
    return Abc_TtCountOnesVecMask( pPats, pMask, p->nPatWords[!c], Abc_LitIsCompl(iLit) );
}